

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

void __thiscall
Js::JavascriptLibrary::EnsureDebugObject(JavascriptLibrary *this,DynamicObject *newDebugObject)

{
  Type *this_00;
  GlobalObject *pGVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  this_00 = &(this->super_JavascriptLibraryBase).debugObject;
  if ((this->super_JavascriptLibraryBase).debugObject.ptr != (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x738,"(!debugObject)","!debugObject");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
    if (this_00->ptr != (DynamicObject *)0x0) {
      return;
    }
  }
  Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierSet(this_00,newDebugObject);
  pGVar1 = (this->super_JavascriptLibraryBase).globalObject.ptr;
  (*(pGVar1->super_RootObjectBase).super_DynamicObject.super_RecyclableObject.
    super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (pGVar1,0x1cc,(this->super_JavascriptLibraryBase).debugObject.ptr,6,0,0,0);
  return;
}

Assistant:

void JavascriptLibrary::EnsureDebugObject(DynamicObject* newDebugObject)
    {
        Assert(!debugObject);

        if (!debugObject)
        {
            this->debugObject = newDebugObject;
            AddMember(globalObject, PropertyIds::Debug, debugObject);
        }
    }